

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O1

void __thiscall ArchiveSpan_ReadSpan_Test::TestBody(ArchiveSpan_ReadSpan_Test *this)

{
  FunctionMocker<void_(pstore::gsl::span<int,__1L>)> *this_00;
  MatcherDescriberInterface MVar1;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *this_01;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_02;
  TypedExpectation<void_(int_&)> *this_03;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_04;
  _func_int *message;
  span<int,__1L> args;
  AssertionResult gtest_ar;
  array<int,_3UL> arr;
  mock_span_archive archive;
  undefined1 local_1b0 [8];
  MatcherBase<pstore::gsl::span<int,__1L>_> local_1a8;
  AssertHelper local_190;
  undefined1 local_188 [16];
  Buffer local_178;
  code *pcStack_170;
  MatcherBase<pstore::gsl::span<int,__1L>_> local_168;
  mock_span_archive local_150;
  
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_150);
  local_150.gmock01_put_280.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198a90;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_150.gmock01_get_281.super_UntypedFunctionMockerBase);
  local_150.gmock01_get_281.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198bf0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_150.gmock01_putn_mock_285.super_UntypedFunctionMockerBase);
  this_00 = &local_150.gmock01_getn_mock_286;
  local_150.gmock01_putn_mock_285.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198e80;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  local_150.gmock01_getn_mock_286.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198fe0;
  local_188._8_8_ =
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_188._0_8_ = &PTR__MatcherBase_00198b50;
  anon_unknown.dwarf_7c001::ArchiveSpan::mock_span_archive::gmock_put
            ((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)local_1b0,&local_150,
             (Matcher<const_int_&> *)local_188);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)
                               local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x153,"archive","put (_)");
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::Times
            (this_01,0);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_1b0 + 8));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)local_188);
  local_188._8_8_ =
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_188._0_8_ = &PTR__MatcherBase_00198f40;
  anon_unknown.dwarf_7c001::ArchiveSpan::mock_span_archive::gmock_putn_mock
            ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)
             local_1b0,&local_150,(Matcher<pstore::gsl::span<int,__1L>_> *)local_188);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
                                *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x154,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_02,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(local_1b0 + 8));
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)local_188);
  local_188._8_8_ =
       testing::internal::MatcherBase<int&>::
       GetVTable<testing::internal::MatcherBase<int&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_188._0_8_ = &PTR__MatcherBase_00198cb0;
  anon_unknown.dwarf_7c001::ArchiveSpan::mock_span_archive::gmock_get
            ((MockSpec<void_(int_&)> *)local_1b0,&local_150,(Matcher<int_&> *)local_188);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      ((MockSpec<void_(int_&)> *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x155,"archive","get (_)");
  testing::internal::TypedExpectation<void_(int_&)>::Times(this_03,0);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)(local_1b0 + 8));
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)local_188);
  local_168.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198f40;
  anon_unknown.dwarf_7c001::ArchiveSpan::mock_span_archive::gmock_getn_mock
            ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)local_1b0,&local_150,
             (Matcher<pstore::gsl::span<int,__1L>_> *)&local_168);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x156,"archive","getn_mock (_)");
  local_188._0_8_ = &DAT_110000000d;
  local_188._8_8_ = (VTable *)0x13;
  local_178.ptr =
       std::
       _Function_handler<void_(pstore::gsl::span<int,_-1L>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp:343:28)>
       ::_M_manager;
  pcStack_170 = std::
                _Function_handler<void_(pstore::gsl::span<int,_-1L>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp:343:28)>
                ::_M_invoke;
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::WillOnce
            (this_04,(Action<void_(pstore::gsl::span<int,__1L>)> *)local_188);
  if ((code *)local_178.ptr != (code *)0x0) {
    (*(code *)local_178)(local_188,local_188,3);
  }
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(local_1b0 + 8));
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase(&local_168);
  local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_1b0 = (undefined1  [8])&local_168;
  local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)local_188;
  do {
    do {
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_3L>,_false>::operator*
                ((span_iterator<pstore::gsl::span<int,_3L>,_false> *)local_1b0);
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_3L>,_false>::operator++
                ((span_iterator<pstore::gsl::span<int,_3L>,_false> *)local_1b0);
      MVar1._vptr_MatcherDescriberInterface =
           local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    } while (local_1b0 != (undefined1  [8])&local_168);
  } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            (&this_00->super_UntypedFunctionMockerBase,&local_150,"getn_mock");
  args.storage_.data_ = (pointer)MVar1._vptr_MatcherDescriberInterface;
  args.storage_.super_extent_type<_1L>.size_ = 3;
  testing::internal::FunctionMocker<void_(pstore::gsl::span<int,_-1L>)>::Invoke(this_00,args);
  local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&DAT_110000000d;
  local_168.vtable_ = (VTable *)CONCAT44(local_168.vtable_._4_4_,0x13);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<int,3ul>>>>
  ::operator()(local_1b0,(char *)&local_168,(array<int,_3UL> *)"arr");
  if (local_1b0[0] == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x171e93;
    }
    else {
      message = *local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x15d,(char *)message);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1b0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::internal::FunctionMocker<void_(pstore::gsl::span<int,_-1L>)>::~FunctionMocker(this_00);
  testing::internal::
  FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
  ~FunctionMocker(&local_150.gmock01_putn_mock_285);
  testing::internal::FunctionMocker<void_(int_&)>::~FunctionMocker(&local_150.gmock01_get_281);
  testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::
  ~FunctionMocker(&local_150.gmock01_put_280);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSpan) {
    using ::testing::_;
    using ::testing::ContainerEq;
    using ::testing::Invoke;

    std::array<int, 3> const expected{{13, 17, 19}};

    mock_span_archive archive;
    EXPECT_CALL (archive, put (_)).Times (0);
    EXPECT_CALL (archive, putn_mock (_)).Times (0);
    EXPECT_CALL (archive, get (_)).Times (0);
    EXPECT_CALL (archive, getn_mock (_))
        .WillOnce (Invoke ([expected] (::pstore::gsl::span<int> sp) {
            std::copy (std::begin (expected), std::end (expected), std::begin (sp));
        }));

    std::array<int, 3> arr;
    pstore::serialize::read (archive, pstore::gsl::make_span (arr));
    EXPECT_THAT (arr, ContainerEq (expected));
}